

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateInitDefaultSplitInstance
          (MessageGenerator *this,Printer *p)

{
  Descriptor *desc;
  FieldDescriptor *field_00;
  undefined8 uVar1;
  bool bVar2;
  reference ppFVar3;
  FieldGenerator *this_00;
  FieldDescriptor *field;
  iterator __end3;
  iterator __begin3;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range3;
  basic_string_view<char,_std::char_traits<char>_> local_190;
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  local_180;
  Span<const_google::protobuf::io::Printer::Sub> local_168;
  undefined1 local_158 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  t;
  Options local_130;
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  local_58;
  Span<const_google::protobuf::io::Printer::Sub> local_40;
  undefined1 local_30 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v;
  Printer *p_local;
  MessageGenerator *this_local;
  
  v.storage_.callback_buffer_._8_8_ = p;
  bVar2 = ShouldSplit(this->descriptor_,&this->options_);
  uVar1 = v.storage_.callback_buffer_._8_8_;
  if (bVar2) {
    desc = this->descriptor_;
    cpp::Options::Options(&local_130,&this->options_);
    cpp::anon_unknown_0::ClassVars(&local_58,desc,&local_130);
    absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
    Span<std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,void,std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,int>
              ((Span<google::protobuf::io::Printer::Sub_const> *)&local_40,&local_58);
    io::Printer::WithVars
              ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
                *)local_30,(Printer *)uVar1,local_40);
    std::
    vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ::~vector(&local_58);
    cpp::Options::~Options(&local_130);
    uVar1 = v.storage_.callback_buffer_._8_8_;
    MakeTrackerCalls(&local_180,this->descriptor_,&this->options_);
    absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
    Span<std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,void,std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,int>
              ((Span<google::protobuf::io::Printer::Sub_const> *)&local_168,&local_180);
    io::Printer::WithVars
              ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
                *)local_158,(Printer *)uVar1,local_168);
    std::
    vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ::~vector(&local_180);
    uVar1 = v.storage_.callback_buffer_._8_8_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_190,"\n");
    io::Printer::SourceLocation::current();
    io::Printer::Emit((Printer *)uVar1,local_190._M_len,local_190._M_str);
    __end3 = std::
             vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ::begin(&this->optimized_order_);
    field = (FieldDescriptor *)
            std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::end(&this->optimized_order_);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                       *)&field), bVar2) {
      ppFVar3 = __gnu_cxx::
                __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                ::operator*(&__end3);
      field_00 = *ppFVar3;
      bVar2 = ShouldSplit(field_00,&this->options_);
      if (bVar2) {
        this_00 = FieldGeneratorTable::get(&this->field_generators_,field_00);
        FieldGenerator::GenerateConstexprAggregateInitializer
                  (this_00,(Printer *)v.storage_.callback_buffer_._8_8_);
      }
      __gnu_cxx::
      __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
      ::operator++(&__end3);
    }
    absl::lts_20250127::
    Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
    ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
                *)local_158);
    absl::lts_20250127::
    Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
    ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
                *)local_30);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateInitDefaultSplitInstance(io::Printer* p) {
  if (!ShouldSplit(descriptor_, options_)) return;

  auto v = p->WithVars(ClassVars(descriptor_, options_));
  auto t = p->WithVars(MakeTrackerCalls(descriptor_, options_));
  p->Emit("\n");
  for (const auto* field : optimized_order_) {
    if (ShouldSplit(field, options_)) {
      field_generators_.get(field).GenerateConstexprAggregateInitializer(p);
    }
  }
}